

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O3

Clause * __thiscall EditDistance::getNaiveExplanation(EditDistance *this)

{
  uint uVar1;
  long *plVar2;
  bool bVar3;
  Clause *pCVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  Clause *c;
  Clause *local_30;
  
  iVar5 = this->seqSize;
  local_30 = (Clause *)malloc((long)iVar5 * 8 + 0xc);
  *(uint *)local_30 = (iVar5 * 2 + 1) * 0x100 | 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_30);
  pCVar4 = local_30;
  if (0 < this->seqSize) {
    lVar6 = 0;
    uVar8 = 1;
    do {
      plVar2 = *(long **)((long)&this->seq1->var + lVar6);
      iVar5 = (**(code **)(*plVar2 + 0x68))(plVar2,(long)*(int *)((long)plVar2 + 0xc),0);
      if (*(uint *)pCVar4 >> 8 <= uVar8) goto LAB_0016c47e;
      pCVar4->data[uVar8].x = iVar5;
      uVar1 = this->seqSize;
      lVar6 = lVar6 + 0x10;
      bVar3 = (long)uVar8 < (long)(int)uVar1;
      uVar8 = uVar8 + 1;
    } while (bVar3);
    if (0 < (int)uVar1) {
      lVar6 = 0;
      lVar7 = 0;
      uVar8 = (ulong)uVar1;
      do {
        plVar2 = *(long **)((long)&this->seq2->var + lVar6);
        iVar5 = (**(code **)(*plVar2 + 0x68))(plVar2,(long)*(int *)((long)plVar2 + 0xc),0);
        if ((ulong)(*(uint *)pCVar4 >> 8) <= uVar8 + 1) {
LAB_0016c47e:
          abort();
        }
        pCVar4[1].data[uVar8 - 1].x = iVar5;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x10;
        uVar8 = uVar8 + 1;
      } while (lVar7 < this->seqSize);
    }
  }
  return pCVar4;
}

Assistant:

Clause* getNaiveExplanation() const {
		// count number of possible values in total

		const int clauseSize = seqSize * 2 + 1;

		Clause* r = Reason_new(clauseSize);

		int offset = 1;

		// insert all clauses for each variable in sequence 1
		for (int i = 0; i < seqSize; i++) {
			// x != val
			(*r)[offset + i] = seq1[i].getLit(seq1[i].getVal(), LR_NE);
		}
		offset += seqSize;
		// insert all clauses for each variable in sequence 2
		for (int i = 0; i < seqSize; i++) {
			// x != val
			(*r)[offset + i] = seq2[i].getLit(seq2[i].getVal(), LR_NE);
		}

		return r;
	}